

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusearef(ASMState *as,IRIns *ir,RegSet allow)

{
  Reg RVar1;
  ASMState *as_00;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  IRIns *irx;
  long lVar2;
  ASMState *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  lVar2 = in_RDI;
  asm_fuseabase((ASMState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                (IRRef)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  RVar1 = ra_alloc1(in_stack_ffffffffffffffe0,(IRRef)((ulong)lVar2 >> 0x20),(RegSet)lVar2);
  *(char *)(in_RDI + 0xa4) = (char)RVar1;
  as_00 = (ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)*(ushort *)(in_RSI + 2) * 8);
  if (*(ushort *)(in_RSI + 2) < 0x8000) {
    *(RegCost *)(in_RDI + 0xa0) = as_00->cost[0] * 8 + *(int *)(in_RDI + 0xa0);
    *(undefined1 *)(in_RDI + 0xa5) = 0x80;
  }
  else {
    *(undefined1 *)(in_RDI + 0xa6) = 0xc0;
    RVar1 = ra_alloc1(as_00,(IRRef)((ulong)lVar2 >> 0x20),(RegSet)lVar2);
    *(char *)(in_RDI + 0xa5) = (char)RVar1;
  }
  return;
}

Assistant:

static void asm_fusearef(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irx;
  lj_assertA(ir->o == IR_AREF, "expected AREF");
  as->mrm.base = (uint8_t)ra_alloc1(as, asm_fuseabase(as, ir->op1), allow);
  irx = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += 8*irx->i;
    as->mrm.idx = RID_NONE;
  } else {
    rset_clear(allow, as->mrm.base);
    as->mrm.scale = XM_SCALE8;
    /* Fuse a constant ADD (e.g. t[i+1]) into the offset.
    ** Doesn't help much without ABCelim, but reduces register pressure.
    */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && ra_noreg(irx->r) &&
	irx->o == IR_ADD && irref_isk(irx->op2)) {
      as->mrm.ofs += 8*IR(irx->op2)->i;
      as->mrm.idx = (uint8_t)ra_alloc1(as, irx->op1, allow);
    } else {
      as->mrm.idx = (uint8_t)ra_alloc1(as, ir->op2, allow);
    }
  }
}